

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord2d *value)

{
  bool bVar1;
  double2 v;
  array<double,_2UL> local_18;
  
  bVar1 = ParseBasicTypeTuple<double,2ul>(this,&local_18);
  if (bVar1) {
    value->s = local_18._M_elems[0];
    value->t = local_18._M_elems[1];
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord2d *value) {
  value::double2 v;
  if (ParseBasicTypeTuple(&v)) {
    value->s = v[0];
    value->t = v[1];
    return true;
  }
  return false;
}